

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::prepareProgramInput
          (GeometryShaderMaxTextureUnitsTest *this)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar6;
  ostream *poVar7;
  undefined8 uVar8;
  TestError *pTVar9;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  int local_35c;
  undefined1 local_358 [4];
  int i_2;
  string local_1d8 [32];
  int local_1b8 [2];
  GLint gs_texture_location;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Functions *gl;
  GeometryShaderMaxTextureUnitsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _i_1 = CONCAT44(extraout_var,iVar3);
  std::
  vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
  ::resize(&this->m_textures,(long)this->m_max_texture_units);
  for (local_1c = 0; local_1c < this->m_max_texture_units; local_1c = local_1c + 1) {
    iVar3 = local_1c * 2;
    pvVar6 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)local_1c);
    pvVar6->data = iVar3 + 1;
    pcVar2 = *(code **)(_i_1 + 0x6f8);
    pvVar6 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)local_1c);
    (*pcVar2)(1,pvVar6);
    pcVar2 = *(code **)(_i_1 + 0xb8);
    pvVar6 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)local_1c);
    (*pcVar2)(0xde1,pvVar6->texture_id);
    dVar4 = (**(code **)(_i_1 + 0x800))();
    glu::checkError(dVar4,"Failed to create texture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x991);
    pcVar2 = *(code **)(_i_1 + 0x1310);
    pvVar6 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)local_1c);
    (*pcVar2)(0xde1,0,0x8235,1,1,0,0x8d94,0x1404,&pvVar6->data);
    (**(code **)(_i_1 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(_i_1 + 0x1360))(0xde1,0x2800,0x2600);
    dVar4 = (**(code **)(_i_1 + 0x800))();
    glu::checkError(dVar4,"Failed to create storage and fill texture with data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x99a);
  }
  local_20 = 0;
  while( true ) {
    if (this->m_max_texture_units <= local_20) {
      for (local_35c = 0; local_35c < this->m_max_texture_units; local_35c = local_35c + 1) {
        (**(code **)(_i_1 + 8))(local_35c + 0x84c0);
        pcVar2 = *(code **)(_i_1 + 0xb8);
        pvVar6 = std::
                 vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
                 ::operator[](&this->m_textures,(long)local_35c);
        (*pcVar2)(0xde1,pvVar6->texture_id);
      }
      dVar4 = (**(code **)(_i_1 + 0x800))();
      glu::checkError(dVar4,"Failed to set texture units up",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x9c0);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar7 = std::operator<<(&local_198,"gs_texture[");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_20);
    std::operator<<(poVar7,"]");
    pcVar2 = *(code **)(_i_1 + 0xb48);
    GVar1 = (this->super_GeometryShaderLimitsRenderingBase).m_program_object_id;
    std::__cxx11::stringstream::str();
    uVar8 = std::__cxx11::string::c_str();
    iVar3 = (*pcVar2)(GVar1,uVar8);
    std::__cxx11::string::~string(local_1d8);
    local_1b8[0] = iVar3;
    if (iVar3 == -1) break;
    iVar3 = (**(code **)(_i_1 + 0x800))();
    if (iVar3 != 0) break;
    (**(code **)(_i_1 + 0x14f0))(local_1b8[0],local_20);
    iVar3 = (**(code **)(_i_1 + 0x800))();
    if (iVar3 != 0) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.
                           super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_358,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_358,
                           (char (*) [36])"Failed to set uniform at location: ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,local_1b8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])" to value: ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_20);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Failed to get uniform isampler2D location",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                 ,0x9b5);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    local_20 = local_20 + 1;
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Failed to get uniform isampler2D location",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
             ,0x9aa);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GeometryShaderMaxTextureUnitsTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_textures.resize(m_max_texture_units);

	/* Prepare texture storage and fill data */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		/* (starting from 1, delta: 2) */
		m_textures[i].data = i * 2 + 1;

		/* Generate and bind texture */
		gl.genTextures(1, &m_textures[i].texture_id);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create texture");

		/* Allocate and upload texture data */
		gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R32I, 1 /* width */, 1 /* height */, 0 /* border */,
					  GL_RED_INTEGER, GL_INT, &m_textures[i].data);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create storage and fill texture with data");
	}

	/* Prepare sampler uniforms */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		/* Prepare name of sampler */
		std::stringstream stream;

		stream << "gs_texture[" << i << "]";

		/* Get sampler location */
		glw::GLint gs_texture_location = gl.getUniformLocation(m_program_object_id, stream.str().c_str());

		if (-1 == gs_texture_location || (GL_NO_ERROR != gl.getError()))
		{
			TCU_FAIL("Failed to get uniform isampler2D location");
		}

		/* Set uniform at sampler location value to index of texture unit */
		gl.uniform1i(gs_texture_location, i);

		if (GL_NO_ERROR != gl.getError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to set uniform at location: " << gs_texture_location
							   << " to value: " << i << tcu::TestLog::EndMessage;

			TCU_FAIL("Failed to get uniform isampler2D location");
		}
	}

	/* Bind textures to texture units */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set texture units up");
}